

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.cpp
# Opt level: O0

MetadataResult ReadFromFile(ShellState *state,char **azArg,idx_t nArg)

{
  char *pcVar1;
  bool bVar2;
  long in_RSI;
  string *file;
  ShellState *in_stack_ffffffffffffffa8;
  undefined1 local_41 [65];
  
  pcVar1 = *(char **)(in_RSI + 8);
  file = (string *)local_41;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_41 + 1),pcVar1,(allocator *)file);
  bVar2 = duckdb_shell::ShellState::ReadFromFile(in_stack_ffffffffffffffa8,file);
  std::__cxx11::string::~string((string *)(local_41 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_41);
  return ((bVar2 ^ 0xffU) & 1) != 0;
}

Assistant:

MetadataResult ReadFromFile(ShellState &state, const char **azArg, idx_t nArg) {
	if (!state.ReadFromFile(azArg[1])) {
		return MetadataResult::FAIL;
	}
	return MetadataResult::SUCCESS;
}